

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

alias_tensor_const_instance * __thiscall
dlib::alias_tensor::operator()
          (alias_tensor_const_instance *__return_storage_ptr__,alias_tensor *this,tensor *t,
          size_t offset)

{
  alias_tensor_instance aStack_58;
  
  (__return_storage_ptr__->inst).super_tensor._vptr_tensor = (_func_int **)&PTR__tensor_001fa488;
  operator()(&aStack_58,this,t,offset);
  (__return_storage_ptr__->inst).super_tensor.m_size = aStack_58.super_tensor.m_size;
  (__return_storage_ptr__->inst).super_tensor.m_n = aStack_58.super_tensor.m_n;
  (__return_storage_ptr__->inst).super_tensor.m_k = aStack_58.super_tensor.m_k;
  (__return_storage_ptr__->inst).super_tensor.m_nr = aStack_58.super_tensor.m_nr;
  (__return_storage_ptr__->inst).super_tensor.m_nc = aStack_58.super_tensor.m_nc;
  (__return_storage_ptr__->inst).data_instance = aStack_58.data_instance;
  (__return_storage_ptr__->inst)._annotation = aStack_58._annotation;
  (__return_storage_ptr__->inst).data_offset = aStack_58.data_offset;
  return __return_storage_ptr__;
}

Assistant:

alias_tensor_const_instance operator() (
            const tensor& t,
            size_t offset = 0
        ) const
        {
            alias_tensor_const_instance temp;
            temp.inst = (*this)(const_cast<tensor&>(t),offset);
            return temp;
        }